

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test>
             *this)

{
  DatarateTestFrameDropLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int>>
  ::parameter_ = &this->parameter_;
  this_00 = (DatarateTestFrameDropLarge *)operator_new(0x4d0);
  datarate_test::anon_unknown_0::DatarateTestFrameDropLarge::DatarateTestFrameDropLarge(this_00);
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_int,_unsigned_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__DatarateTestFrameDropLarge_0102fd10;
  (this_00->super_CodecTestWith3Params<libaom_test::TestMode,_int,_unsigned_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test_0102fd58;
  (this_00->super_DatarateTest).super_EncoderTest._vptr_EncoderTest =
       (_func_int **)&PTR__DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test_0102fd78;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }